

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

Vector<float,_4> __thiscall
tcu::Vector<unsigned_long,_4>::cast<float>(Vector<unsigned_long,_4> *this)

{
  int i;
  long lVar1;
  long in_RSI;
  float fVar2;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar3;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar4;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    fVar2 = (float)*(ulong *)(in_RSI + lVar1 * 8);
    uVar3 = CONCAT44((int)((ulong)uVar3 >> 0x20),fVar2);
    *(float *)((long)this->m_data + lVar1 * 4) = fVar2;
  }
  VVar4.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar4.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)((ulong)uVar3 >> 0x20);
  return (Vector<float,_4>)VVar4.m_data;
}

Assistant:

inline Vector<NewT, Size> Vector<T, Size>::cast (void) const
{
	Vector<NewT, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = NewT(m_data[i]);
	return res;
}